

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

void __thiscall TTD::EventLog::RecordEmitLogEvent(EventLog *this,JavascriptString *uriString)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  BOOL BVar4;
  HeapAllocator *this_00;
  undefined4 *puVar5;
  utf8char_t *dest;
  char16 *source;
  size_t emitUriLength;
  ulong byteSize;
  undefined1 local_68 [8];
  TrackAllocData data;
  AutoArrayPtr<char> uri;
  
  RecordGetInitializedEvent_DataOnly<TTD::NSLogEvents::ExplicitLogWriteEventLogEntry,(TTD::NSLogEvents::EventKind)13>
            (this);
  cVar3 = Js::JavascriptString::GetLength(uriString);
  if (0x55555555 < cVar3) {
    Math::DefaultOverflowPolicy();
  }
  byteSize = (ulong)(cVar3 * 3);
  local_68 = (undefined1  [8])&char::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_4012208;
  data.filename._0_4_ = 0x364;
  data.plusSize = byteSize;
  this_00 = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_68);
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_008e1e36;
    *puVar5 = 0;
  }
  dest = (utf8char_t *)Memory::HeapAllocator::AllocT<false>(this_00,byteSize);
  memset(dest,0,byteSize);
  if (dest == (utf8char_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_008e1e36:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  data._32_8_ = dest;
  source = Js::JavascriptString::GetString(uriString);
  cVar3 = Js::JavascriptString::GetLength(uriString);
  emitUriLength = utf8::EncodeInto<(utf8::Utf8EncodingKind)0>(dest,byteSize,source,cVar3);
  EmitLog(this,(char *)data._32_8_,emitUriLength,(EventLogEntry *)0x0);
  AutoArrayPtr<char>::~AutoArrayPtr((AutoArrayPtr<char> *)&data.line);
  return;
}

Assistant:

void EventLog::RecordEmitLogEvent(Js::JavascriptString* uriString)
    {
        this->RecordGetInitializedEvent_DataOnly<NSLogEvents::ExplicitLogWriteEventLogEntry, NSLogEvents::EventKind::ExplicitLogWriteTag>();

        size_t cbUri = UInt32Math::Mul<3>(uriString->GetLength());
        AutoArrayPtr<char> uri(HeapNewArrayZ(char, cbUri), cbUri);
        size_t uriLength = utf8::EncodeInto<utf8::Utf8EncodingKind::Cesu8>((LPUTF8)((char*)uri), cbUri, uriString->GetString(), uriString->GetLength());

        this->EmitLog(uri, uriLength);
    }